

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O0

void __thiscall HPrimal::primalChooseRow(HPrimal *this)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  HMatrix *this_00;
  int *piVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RDI;
  double dVar7;
  double dVar8;
  double tightSpace_1;
  double tightSpace;
  double alpha_1;
  int index_1;
  int i_1;
  double bestAlpha;
  double relaxSpace_1;
  double relaxSpace;
  double alpha;
  int index;
  int i;
  double relaxTheta;
  int moveIn;
  int *jMove;
  double alphaTol;
  double primalTolerance;
  double *baseValue;
  double *baseUpper;
  double *baseLower;
  double in_stack_ffffffffffffff50;
  HVector *in_stack_ffffffffffffff58;
  HFactor *in_stack_ffffffffffffff60;
  double dVar9;
  HVector *in_stack_ffffffffffffff70;
  int local_74;
  double local_70;
  int local_4c;
  double local_48;
  double in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  int iVar10;
  HVector *vector;
  
  iVar10 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  pdVar2 = HModel::getBaseLower((HModel *)0x189145);
  pdVar3 = HModel::getBaseUpper((HModel *)0x18915e);
  this_00 = (HMatrix *)HModel::getBaseValue((HModel *)0x189177);
  vector = *(HVector **)(*(long *)(in_RDI + 0x18) + 0x28);
  HVector::clear(in_stack_ffffffffffffff70);
  *(undefined1 *)(in_RDI + 0x230) = 1;
  HModel::getMatrix(*(HModel **)(in_RDI + 0x18));
  HMatrix::collect_aj(this_00,vector,iVar10,in_stack_ffffffffffffffc8);
  HModel::getFactor(*(HModel **)(in_RDI + 0x18));
  HFactor::ftran(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  *(double *)(in_RDI + 0x270) =
       *(double *)(in_RDI + 0x270) * 0.95 +
       ((double)*(int *)(in_RDI + 0x1b4) * 0.05) / (double)*(int *)(in_RDI + 0x24);
  *(undefined4 *)(in_RDI + 0x3c) = 0xffffffff;
  if (*(int *)(in_RDI + 0x30) < 10) {
    dVar9 = 1e-09;
  }
  else {
    dVar9 = 1e-08;
    if (0x13 < *(int *)(in_RDI + 0x30)) {
      dVar9 = 1e-07;
    }
  }
  piVar4 = HModel::getNonbasicMove((HModel *)0x1892c3);
  iVar10 = piVar4[*(int *)(in_RDI + 0x38)];
  local_48 = 1e+100;
  for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x1b4); local_4c = local_4c + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b8),(long)local_4c);
    iVar1 = *pvVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1d0),(long)iVar1);
    dVar7 = *pvVar6 * (double)iVar10;
    if (dVar7 <= dVar9) {
      if ((dVar7 < -dVar9) &&
         (dVar8 = (*(double *)(&this_00->numCol + (long)iVar1 * 2) - pdVar3[iVar1]) - (double)vector
         , local_48 * dVar7 < dVar8)) {
        local_48 = dVar8 / dVar7;
      }
    }
    else {
      dVar8 = (*(double *)(&this_00->numCol + (long)iVar1 * 2) - pdVar2[iVar1]) + (double)vector;
      if (dVar8 < local_48 * dVar7) {
        local_48 = dVar8 / dVar7;
      }
    }
  }
  local_70 = 0.0;
  for (local_74 = 0; local_74 < *(int *)(in_RDI + 0x1b4); local_74 = local_74 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b8),(long)local_74);
    iVar1 = *pvVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1d0),(long)iVar1);
    dVar7 = *pvVar6 * (double)iVar10;
    if (dVar7 <= dVar9) {
      if (((dVar7 < -dVar9) &&
          (local_48 * dVar7 < *(double *)(&this_00->numCol + (long)iVar1 * 2) - pdVar3[iVar1])) &&
         (local_70 < -dVar7)) {
        *(int *)(in_RDI + 0x3c) = iVar1;
        local_70 = -dVar7;
      }
    }
    else if ((*(double *)(&this_00->numCol + (long)iVar1 * 2) - pdVar2[iVar1] < local_48 * dVar7) &&
            (local_70 < dVar7)) {
      *(int *)(in_RDI + 0x3c) = iVar1;
      local_70 = dVar7;
    }
  }
  return;
}

Assistant:

void HPrimal::primalChooseRow() {
    const double *baseLower = model->getBaseLower();
    const double *baseUpper = model->getBaseUpper();
    double *baseValue = model->getBaseValue();
    const double primalTolerance = model->dblOption[DBLOPT_PRIMAL_TOL];

    // Compute pivot column
    column.clear();
    column.packFlag = true;
    model->getMatrix()->collect_aj(column, columnIn, 1);
    model->getFactor()->ftran(column, columnDensity);
    columnDensity = 0.95 * columnDensity + 0.05 * column.count / numRow;

    // Initialize
    rowOut = -1;

    // Choose column pass 1
    double alphaTol = countUpdate < 10 ? 1e-9 : countUpdate < 20 ? 1e-8 : 1e-7;
    const int *jMove = model->getNonbasicMove();
    int moveIn = jMove[columnIn];
    if (moveIn == 0) {
        // If there's still free in the N
        // We would report not-solved
        // Need to handle free
    }
    double relaxTheta = 1e100;
    for (int i = 0; i < column.count; i++) {
        int index = column.index[i];
        double alpha = column.array[index] * moveIn;
        if (alpha > alphaTol) {
            double relaxSpace = baseValue[index] - baseLower[index]
                    + primalTolerance;
            if (relaxSpace < relaxTheta * alpha)
                relaxTheta = relaxSpace / alpha;
        } else if (alpha < -alphaTol) {
            double relaxSpace = baseValue[index] - baseUpper[index]
                    - primalTolerance;
            if (relaxSpace > relaxTheta * alpha)
                relaxTheta = relaxSpace / alpha;
        }
    }

    // Choose column pass 2
    double bestAlpha = 0;
    for (int i = 0; i < column.count; i++) {
        int index = column.index[i];
        double alpha = column.array[index] * moveIn;
        if (alpha > alphaTol) {
            double tightSpace = baseValue[index] - baseLower[index];
            if (tightSpace < relaxTheta * alpha) {
                if (bestAlpha < alpha) {
                    bestAlpha = alpha;
                    rowOut = index;
                }
            }
        } else if (alpha < -alphaTol) {
            double tightSpace = baseValue[index] - baseUpper[index];
            if (tightSpace > relaxTheta * alpha) {
                if (bestAlpha < -alpha) {
                    bestAlpha = -alpha;
                    rowOut = index;
                }
            }
        }
    }

}